

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O2

void __thiscall
henson::Coroutine<henson::PythonPuppet>::Coroutine
          (Coroutine<henson::PythonPuppet> *this,string *name)

{
  allocator local_31;
  string local_30 [32];
  
  BaseCoroutine::BaseCoroutine(&this->super_BaseCoroutine,name);
  std::__cxx11::string::string(local_30,"henson",&local_31);
  spdlog::get((string *)&this->log_);
  std::__cxx11::string::~string(local_30);
  coro_stack_alloc(&this->stack_,0x800000);
  coro_create(&this->to_,PythonPuppet::exec,this,(this->stack_).sptr,(this->stack_).ssze);
  coro_create(&this->from_,0,0,0,0);
  return;
}

Assistant:

Coroutine(const std::string& name):
                            BaseCoroutine(name)
                        {
#ifdef USE_BOOST
                            to_ = bc::callcc([this](context_t&& from)
                                  {
                                      from_ = std::move(from);
                                      from_ = from_.resume();
                                      Derived::exec(this);
                                      return std::move(from_);
                                  });
#else
                            coro_stack_alloc(&stack_, 8*1024*1024);     // 8MB stack
                            coro_create(&to_, Derived::exec, this, stack_.sptr, stack_.ssze);
                            coro_create(&from_, NULL, NULL, NULL, 0);
#endif
                        }